

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerCPP::emit_function_prototype
          (CompilerCPP *this,SPIRFunction *func,Bitset *param_2)

{
  uint uVar1;
  SPIRType *pSVar2;
  SPIRVariable *pSVar3;
  long lVar4;
  Parameter *arg;
  Parameter *arg_00;
  string decl;
  string local_50;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&(this->super_CompilerGLSL).local_variable_names,
             &(this->super_CompilerGLSL).resource_names._M_h);
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  pSVar2 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(func->super_IVariant).field_0xc);
  ::std::__cxx11::string::append((char *)&decl);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_50,this,pSVar2,0);
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::append((char *)&decl);
  uVar1 = (func->super_IVariant).self.id;
  if (uVar1 == (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    ::std::__cxx11::string::append((char *)&decl);
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_50,this,(ulong)uVar1,1);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::append((char *)&decl);
  arg_00 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  for (lVar4 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
               * 0x14; lVar4 != 0; lVar4 = lVar4 + -0x14) {
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(arg_00->id).id);
    argument_decl_abi_cxx11_(&local_50,this,arg_00);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (arg_00 != (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr +
                  ((func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                   buffer_size - 1)) {
      ::std::__cxx11::string::append((char *)&decl);
    }
    pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,(arg_00->id).id);
    if (pSVar3 != (SPIRVariable *)0x0) {
      pSVar3->parameter = arg_00;
    }
    arg_00 = arg_00 + 1;
  }
  ::std::__cxx11::string::append((char *)&decl);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&decl);
  ::std::__cxx11::string::~string((string *)&decl);
  return;
}

Assistant:

void CompilerCPP::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	auto &type = get<SPIRType>(func.return_type);
	decl += "inline ";
	decl += type_to_glsl(type);
	decl += " ";

	if (func.self == ir.default_entry_point)
	{
		decl += "main";
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	for (auto &arg : func.arguments)
	{
		add_local_variable_name(arg.id);

		decl += argument_decl(arg);
		if (&arg != &func.arguments.back())
			decl += ", ";

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += ")";
	statement(decl);
}